

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall
gl3cts::ParenthesisInLayoutQualifierIntegerValuesTest::deinit
          (ParenthesisInLayoutQualifierIntegerValuesTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  ParenthesisInLayoutQualifierIntegerValuesTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_cs_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))(this->m_cs_id);
    this->m_cs_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  return;
}

Assistant:

void ParenthesisInLayoutQualifierIntegerValuesTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_cs_id != 0)
	{
		gl.deleteShader(m_cs_id);

		m_cs_id = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}
}